

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustnessTests.cpp
# Opt level: O1

bool __thiscall
es32cts::RobustBufferAccessBehavior::ReadnPixelsTest::verifyError
          (ReadnPixelsTest *this,GLint error,GLint expectedError,char *method)

{
  size_t sVar1;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  if (error != expectedError) {
    local_1a0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"Test failed! ",0xd);
    if (method == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
    }
    else {
      sVar1 = strlen(method);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,method,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198," throws unexpected error [",0x1a);
    std::ostream::operator<<((ostringstream *)&local_198,error);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"].",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  return error == expectedError;
}

Assistant:

bool ReadnPixelsTest::verifyError(GLint error, GLint expectedError, const char* method)
{
	if (error != expectedError)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! " << method << " throws unexpected error ["
						   << error << "]." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}